

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O2

void __thiscall CLI::IsMember::IsMember<int>(IsMember *this,initializer_list<int> values)

{
  allocator_type local_29;
  _Vector_base<int,_std::allocator<int>_> local_28;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_28,values,&local_29);
  IsMember<std::vector<int,std::allocator<int>>>
            (this,(vector<int,_std::allocator<int>_> *)&local_28);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

IsMember(std::initializer_list<T> values, Args &&...args)
        : IsMember(std::vector<T>(values), std::forward<Args>(args)...) {}